

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_Apu.cpp
# Opt level: O3

void __thiscall Simple_Apu::end_frame(Simple_Apu *this)

{
  ulong uVar1;
  
  this->time = 0;
  uVar1 = this->frame_length ^ 1;
  this->frame_length = uVar1;
  Nes_Apu::end_frame(&this->apu,uVar1);
  uVar1 = (this->buf).factor_ * this->frame_length + (this->buf).offset_;
  (this->buf).offset_ = uVar1;
  if (uVar1 >> 0x10 <= (ulong)(this->buf).buffer_size_) {
    return;
  }
  __assert_fail("( \"Blip_Buffer::end_frame(): Frame went past end of buffer\", samples_avail() <= (long) buffer_size_ )"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.h"
                ,0xe6,"void Blip_Buffer::end_frame(blip_time_t)");
}

Assistant:

void Simple_Apu::end_frame()
{
	time = 0;
	frame_length ^= 1;
	apu.end_frame( frame_length );
	buf.end_frame( frame_length );
}